

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

void __thiscall QByteArray::reallocGrowData(QByteArray *this,qsizetype n)

{
  bool bVar1;
  char *pcVar2;
  QPodArrayOps<char> *this_00;
  QArrayDataPointer<char> *pQVar3;
  QArrayDataPointer<char> *in_RDI;
  long in_FS_OFFSET;
  GrowthPosition unaff_retaddr;
  qsizetype in_stack_00000008;
  QArrayDataPointer<char> *in_stack_00000010;
  DataPointer dd;
  AllocationOption in_stack_ffffffffffffff9c;
  QArrayDataPointer<char> *in_stack_ffffffffffffffa0;
  QPodArrayOps<char> *in_stack_ffffffffffffffa8;
  QArrayDataPointer<char> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QArrayDataPointer<char>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<char>::needsDetach(in_stack_ffffffffffffffa0);
  if (bVar1) {
    local_20.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_20.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<char>::allocateGrow(in_stack_00000010,in_stack_00000008,unaff_retaddr);
    pcVar2 = QArrayDataPointer<char>::data(&local_20);
    if (pcVar2 == (char *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        qBadAlloc();
      }
      goto LAB_004b437e;
    }
    pQVar3 = (QArrayDataPointer<char> *)QArrayDataPointer<char>::operator->(&local_20);
    this_00 = (QPodArrayOps<char> *)QArrayDataPointer<char>::data(in_RDI);
    QArrayDataPointer<char>::data(in_RDI);
    QtPrivate::QPodArrayOps<char>::copyAppend
              (this_00,(char *)pQVar3,(char *)in_stack_ffffffffffffffa0);
    pcVar2 = QArrayDataPointer<char>::data(&local_20);
    pcVar2[local_20.size] = '\0';
    QArrayDataPointer<char>::operator=(pQVar3,in_stack_ffffffffffffffa0);
    QArrayDataPointer<char>::~QArrayDataPointer(in_stack_ffffffffffffffa0);
  }
  else {
    pQVar3 = (QArrayDataPointer<char> *)QArrayDataPointer<char>::operator->(in_RDI);
    QArrayDataPointer<char>::constAllocatedCapacity(pQVar3);
    QtPrivate::QPodArrayOps<char>::reallocate
              (in_stack_ffffffffffffffa8,(qsizetype)pQVar3,in_stack_ffffffffffffff9c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_004b437e:
  __stack_chk_fail();
}

Assistant:

void QByteArray::reallocGrowData(qsizetype n)
{
    if (!n)  // expected to always allocate
        n = 1;

    if (d->needsDetach()) {
        DataPointer dd(DataPointer::allocateGrow(d, n, QArrayData::GrowsAtEnd));
        Q_CHECK_PTR(dd.data());
        dd->copyAppend(d.data(), d.data() + d.size);
        dd.data()[dd.size] = 0;
        d = dd;
    } else {
        d->reallocate(d.constAllocatedCapacity() + n, QArrayData::Grow);
    }
}